

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::ResolveTargetsInGeneratorExpression
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  cmLocalGenerator *this_00;
  string errorString;
  string targetName_1;
  
  while (lVar2 = std::__cxx11::string::find((char *)input,0x5595e9), lVar2 != -1) {
    uVar3 = std::__cxx11::string::find((char *)input,0x541010);
    uVar4 = std::__cxx11::string::find((char *)input,0x56111f);
    uVar5 = std::__cxx11::string::find((char *)input,0x54612f);
    if ((((uVar4 <= uVar5) && (uVar4 <= uVar3)) && (uVar3 != 0xffffffffffffffff)) &&
       (uVar4 != 0xffffffffffffffff)) {
      std::__cxx11::string::substr((ulong)&errorString,(ulong)input);
      bVar1 = AddTargetNamespace(this,&errorString,target,missingTargets);
      if (bVar1) {
        std::__cxx11::string::replace
                  ((ulong)input,lVar2 + 0x12U,(string *)(uVar4 - (lVar2 + 0x12U)));
      }
      std::__cxx11::string::~string((string *)&errorString);
    }
  }
  errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
  errorString._M_string_length = 0;
  errorString.field_2._M_local_buf[0] = '\0';
  do {
    uVar3 = std::__cxx11::string::find((char *)input,0x546716);
    if (uVar3 == 0xffffffffffffffff) break;
    lVar2 = std::__cxx11::string::find((char *)input,0x541010);
    if (lVar2 == -1) {
      std::__cxx11::string::assign((char *)&errorString);
      break;
    }
    std::__cxx11::string::substr((ulong)&targetName_1,(ulong)input);
    lVar6 = std::__cxx11::string::find((char *)&targetName_1,0x54612f);
    if ((lVar6 == -1) &&
       (bVar1 = AddTargetNamespace(this,&targetName_1,target,missingTargets), bVar1)) {
      std::__cxx11::string::replace((ulong)input,uVar3,(string *)((lVar2 - uVar3) + 1));
      bVar1 = true;
    }
    else {
      std::__cxx11::string::assign((char *)&errorString);
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&targetName_1);
  } while (bVar1);
  while( true ) {
    if ((errorString._M_string_length != 0) ||
       (lVar2 = std::__cxx11::string::find((char *)input,0x554dee), lVar2 == -1)) goto LAB_003f8e18;
    lVar6 = std::__cxx11::string::find((char *)input,0x541010);
    if (lVar6 == -1) break;
    std::__cxx11::string::substr((ulong)&targetName_1,(ulong)input);
    bVar1 = cmGeneratorExpression::IsValidTargetName(&targetName_1);
    if ((bVar1) && (bVar1 = AddTargetNamespace(this,&targetName_1,target,missingTargets), bVar1)) {
      std::__cxx11::string::replace((ulong)input,lVar2 + 0xcU,(string *)(lVar6 - (lVar2 + 0xcU)));
    }
    std::__cxx11::string::~string((string *)&targetName_1);
  }
  std::__cxx11::string::assign((char *)&errorString);
LAB_003f8e18:
  (*this->_vptr_cmExportFileGenerator[5])(this,input);
  if (errorString._M_string_length != 0) {
    this_00 = cmGeneratorTarget::GetLocalGenerator(target);
    cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&errorString);
  }
  std::__cxx11::string::~string((string *)&errorString);
  return;
}

Assistant:

void
cmExportFileGenerator::ResolveTargetsInGeneratorExpression(
                                    std::string &input,
                                    cmGeneratorTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;

  while((pos = input.find("$<TARGET_PROPERTY:", lastPos)) != input.npos)
    {
    std::string::size_type nameStartPos = pos +
                                            sizeof("$<TARGET_PROPERTY:") - 1;
    std::string::size_type closePos = input.find(">", nameStartPos);
    std::string::size_type commaPos = input.find(",", nameStartPos);
    std::string::size_type nextOpenPos = input.find("$<", nameStartPos);
    if (commaPos == input.npos // Implied 'this' target
        || closePos == input.npos // Imcomplete expression.
        || closePos < commaPos // Implied 'this' target
        || nextOpenPos < commaPos) // Non-literal
      {
      lastPos = nameStartPos;
      continue;
      }

    std::string targetName = input.substr(nameStartPos,
                                                commaPos - nameStartPos);

    if (this->AddTargetNamespace(targetName, target, missingTargets))
      {
      input.replace(nameStartPos, commaPos - nameStartPos, targetName);
      }
    lastPos = nameStartPos + targetName.size() + 1;
    }

  std::string errorString;
  pos = 0;
  lastPos = pos;
  while((pos = input.find("$<TARGET_NAME:", lastPos)) != input.npos)
    {
    std::string::size_type nameStartPos = pos + sizeof("$<TARGET_NAME:") - 1;
    std::string::size_type endPos = input.find(">", nameStartPos);
    if (endPos == input.npos)
      {
      errorString = "$<TARGET_NAME:...> expression incomplete";
      break;
      }
    std::string targetName = input.substr(nameStartPos,
                                                endPos - nameStartPos);
    if(targetName.find("$<") != input.npos)
      {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "literal.";
      break;
      }
    if (!this->AddTargetNamespace(targetName, target, missingTargets))
      {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "reachable target.";
      break;
      }
    input.replace(pos, endPos - pos + 1, targetName);
    lastPos = endPos;
    }

  pos = 0;
  lastPos = pos;
  while (errorString.empty() &&
         (pos = input.find("$<LINK_ONLY:", lastPos)) != input.npos)
    {
    std::string::size_type nameStartPos = pos + sizeof("$<LINK_ONLY:") - 1;
    std::string::size_type endPos = input.find(">", nameStartPos);
    if (endPos == input.npos)
      {
      errorString = "$<LINK_ONLY:...> expression incomplete";
      break;
      }
    std::string libName = input.substr(nameStartPos, endPos - nameStartPos);
    if (cmGeneratorExpression::IsValidTargetName(libName) &&
        this->AddTargetNamespace(libName, target, missingTargets))
      {
      input.replace(nameStartPos, endPos - nameStartPos, libName);
      }
    lastPos = nameStartPos + libName.size() + 1;
    }

  this->ReplaceInstallPrefix(input);

  if (!errorString.empty())
    {
    target->GetLocalGenerator()->IssueMessage(cmake::FATAL_ERROR, errorString);
    }
}